

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

PrimInfo * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
          *this,PrimRef *prims,BBox1f *time_range,range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  BBox1f BVar2;
  uint uVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  BufferView<embree::Vec3fa> *pBVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  BufferView<embree::Vec3fa> *pBVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  int iVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  ulong uVar24;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  long lVar25;
  int iVar26;
  size_t itime;
  unsigned_long uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar49 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  float fVar72;
  float fVar73;
  float fVar74;
  vfloat4 a0;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar86;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [64];
  undefined1 auVar92 [16];
  undefined1 auVar93 [64];
  float fVar94;
  undefined1 auVar95 [64];
  undefined1 auVar96 [32];
  float fVar97;
  float fVar98;
  vfloat4 b1;
  float fVar99;
  float fVar100;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined4 uVar103;
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  size_t local_268;
  size_t local_260;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  anon_class_16_2_07cfa4d6 local_200;
  ulong local_1f0;
  undefined1 local_1e8 [16];
  float local_1d8;
  float fStack_1d4;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_1c0;
  int local_1b8;
  undefined4 uStack_1b4;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_1a0;
  float local_198;
  undefined4 uStack_194;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 uStack_180;
  float local_178;
  undefined4 uStack_174;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  
  local_258._8_4_ = 0x7f800000;
  local_258._0_8_ = 0x7f8000007f800000;
  local_258._12_4_ = 0x7f800000;
  auVar91 = ZEXT1664(local_258);
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
   m128 = local_258;
  local_248._8_4_ = 0xff800000;
  local_248._0_8_ = 0xff800000ff800000;
  local_248._12_4_ = 0xff800000;
  auVar93 = ZEXT1664(local_248);
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
   m128 = local_248;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
   m128 = local_258;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
   m128 = local_248;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  auVar75._8_8_ = 0;
  auVar75._0_4_ =
       (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
       super_Geometry.time_range.lower;
  auVar75._4_4_ =
       (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
       super_Geometry.time_range.upper;
  auVar39._8_8_ = 0;
  auVar39._0_4_ = time_range->lower;
  auVar39._4_4_ = time_range->upper;
  uVar21 = vcmpps_avx512vl(auVar75,auVar39,1);
  auVar28 = vinsertps_avx(auVar39,auVar75,0x50);
  auVar75 = vinsertps_avx(auVar75,auVar39,0x50);
  auVar39 = in_YmmResult._16_16_;
  bVar10 = (bool)((byte)uVar21 & 1);
  local_1e8._0_4_ = (uint)bVar10 * auVar28._0_4_ | (uint)!bVar10 * auVar75._0_4_;
  bVar10 = (bool)((byte)(uVar21 >> 1) & 1);
  local_1e8._4_4_ = (uint)bVar10 * auVar28._4_4_ | (uint)!bVar10 * auVar75._4_4_;
  bVar10 = (bool)((byte)(uVar21 >> 2) & 1);
  local_1e8._8_4_ = (uint)bVar10 * auVar28._8_4_ | (uint)!bVar10 * auVar75._8_4_;
  bVar10 = (bool)((byte)(uVar21 >> 3) & 1);
  local_1e8._12_4_ = (uint)bVar10 * auVar28._12_4_ | (uint)!bVar10 * auVar75._12_4_;
  auVar28 = vmovshdup_avx(local_1e8);
  fVar94 = auVar28._0_4_;
  if ((float)local_1e8._0_4_ <= fVar94) {
    uVar27 = r->_begin;
    local_260 = 0;
    auVar95 = ZEXT1664(ZEXT816(0) << 0x40);
    auVar28 = vbroadcastss_avx512vl(ZEXT416(0xddccb9a2));
    auVar104 = ZEXT1664(auVar28);
    auVar28 = vbroadcastss_avx512vl(ZEXT416(0x5dccb9a2));
    auVar105 = ZEXT1664(auVar28);
    local_268 = k;
LAB_01c332b0:
    auVar75 = auVar93._0_16_;
    auVar28 = auVar91._0_16_;
    if (uVar27 < r->_end) {
      BVar2 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry
              .super_Geometry.time_range;
      auVar49._8_8_ = 0;
      auVar49._0_4_ = BVar2.lower;
      auVar49._4_4_ = BVar2.upper;
      auVar31 = vmovshdup_avx(auVar49);
      auVar31 = vsubps_avx(auVar31,auVar49);
      uVar3 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>)
                                  .super_CurveGeometry.super_Geometry.field_0x58 +
                       *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                 super_CurveGeometry.field_0x68 * uVar27);
      uVar21 = (ulong)uVar3;
      uVar22 = (ulong)(uVar3 + 1);
      pBVar4 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
               super_CurveGeometry.vertices.items;
      if (uVar22 < (pBVar4->super_RawBufferView).num) {
        fVar1 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                super_CurveGeometry.super_Geometry.fnumTimeSegments;
        auVar49 = ZEXT416((uint)(fVar1 * ((fVar94 - BVar2.lower) / auVar31._0_4_) * 0.99999976));
        auVar49 = vroundss_avx(auVar49,auVar49,10);
        auVar49 = vminss_avx(auVar49,ZEXT416((uint)fVar1));
        auVar31 = ZEXT416((uint)(fVar1 * (((float)local_1e8._0_4_ - BVar2.lower) / auVar31._0_4_) *
                                         1.0000002));
        auVar31 = vroundss_avx(auVar31,auVar31,9);
        auVar31 = vmaxss_avx(auVar95._0_16_,auVar31);
        pBVar5 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                 super_CurveGeometry.normals.items;
        pBVar6 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                 super_CurveGeometry.tangents.items;
        fVar72 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                 super_CurveGeometry.maxRadiusScale;
        uStack_194 = SUB84(bezier_basis0._476_8_,4);
        uStack_190 = bezier_basis0._484_8_;
        uStack_188 = bezier_basis0._492_8_;
        uStack_180 = bezier_basis0._500_8_;
        uStack_1b4 = SUB84(bezier_basis0._1632_8_,4);
        uStack_1b0 = bezier_basis0._1640_8_;
        uStack_1a8 = bezier_basis0._1648_8_;
        uStack_1a0 = bezier_basis0._1656_8_;
        uStack_174 = SUB84(bezier_basis0._2788_8_,4);
        uStack_170 = bezier_basis0._2796_8_;
        uStack_168 = bezier_basis0._2804_8_;
        uStack_160 = bezier_basis0._2812_8_;
        local_1d8 = (float)bezier_basis0._3944_8_;
        fStack_1d4 = SUB84(bezier_basis0._3944_8_,4);
        uStack_1d0 = bezier_basis0._3952_8_;
        uStack_1c8 = bezier_basis0._3960_8_;
        uStack_1c0 = bezier_basis0._3968_8_;
        pBVar7 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                 super_CurveGeometry.dnormals.items;
        lVar25 = (long)(int)auVar31._0_4_ * 0x38 + 0x10;
        uVar24 = (long)(int)auVar31._0_4_ - 1;
LAB_01c33421:
        uVar24 = uVar24 + 1;
        if ((ulong)(long)(int)auVar49._0_4_ < uVar24) {
          local_200.primID = &local_1f0;
          fVar72 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                   super_CurveGeometry.super_Geometry.time_range.lower;
          local_198 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                      super_CurveGeometry.super_Geometry.time_range.upper - fVar72;
          local_178 = ((float)local_1e8._0_4_ - fVar72) / local_198;
          local_198 = (fVar94 - fVar72) / local_198;
          fVar72 = fVar1 * local_178;
          fVar74 = fVar1 * local_198;
          auVar32 = vroundss_avx(ZEXT416((uint)fVar72),ZEXT416((uint)fVar72),9);
          auVar35 = vroundss_avx(ZEXT416((uint)fVar74),ZEXT416((uint)fVar74),10);
          auVar31 = vmaxss_avx(auVar32,ZEXT816(0));
          auVar49 = vminss_avx(auVar35,ZEXT416((uint)fVar1));
          iVar23 = (int)auVar31._0_4_;
          fVar86 = auVar49._0_4_;
          local_1b8 = (int)auVar32._0_4_;
          iVar26 = -1;
          if (-1 < local_1b8) {
            iVar26 = local_1b8;
          }
          iVar15 = (int)fVar1 + 1;
          if ((int)auVar35._0_4_ < (int)fVar1 + 1) {
            iVar15 = (int)auVar35._0_4_;
          }
          local_200.this = this;
          local_1f0 = uVar27;
          linearBounds::anon_class_16_2_07cfa4d6::operator()(&blower0,&local_200,(long)iVar23);
          local_1d8 = (float)(int)fVar86;
          linearBounds::anon_class_16_2_07cfa4d6::operator()(&bupper1,&local_200,(long)(int)fVar86);
          fVar72 = fVar72 - auVar31._0_4_;
          if (iVar15 - iVar26 == 1) {
            auVar49 = ZEXT816(0) << 0x40;
            auVar31 = vmaxss_avx(ZEXT416((uint)fVar72),auVar49);
            fVar72 = auVar31._0_4_;
            fVar1 = 1.0 - fVar72;
            auVar43._0_4_ = fVar72 * bupper1.lower.field_0._0_4_;
            auVar43._4_4_ = fVar72 * bupper1.lower.field_0._4_4_;
            auVar43._8_4_ = fVar72 * bupper1.lower.field_0._8_4_;
            auVar43._12_4_ = fVar72 * bupper1.lower.field_0._12_4_;
            auVar40._4_4_ = fVar1;
            auVar40._0_4_ = fVar1;
            auVar40._8_4_ = fVar1;
            auVar40._12_4_ = fVar1;
            auVar32 = vfmadd231ps_fma(auVar43,auVar40,(undefined1  [16])blower0.lower.field_0);
            auVar46._0_4_ = fVar72 * bupper1.upper.field_0._0_4_;
            auVar46._4_4_ = fVar72 * bupper1.upper.field_0._4_4_;
            auVar46._8_4_ = fVar72 * bupper1.upper.field_0._8_4_;
            auVar46._12_4_ = fVar72 * bupper1.upper.field_0._12_4_;
            auVar35 = vfmadd231ps_fma(auVar46,(undefined1  [16])blower0.upper.field_0,auVar40);
            auVar31 = vmaxss_avx(ZEXT416((uint)(fVar86 - fVar74)),auVar49);
            fVar72 = auVar31._0_4_;
            fVar1 = 1.0 - fVar72;
            auVar90._0_4_ = fVar72 * blower0.lower.field_0._0_4_;
            auVar90._4_4_ = fVar72 * blower0.lower.field_0._4_4_;
            auVar90._8_4_ = fVar72 * blower0.lower.field_0._8_4_;
            auVar90._12_4_ = fVar72 * blower0.lower.field_0._12_4_;
            auVar41._4_4_ = fVar1;
            auVar41._0_4_ = fVar1;
            auVar41._8_4_ = fVar1;
            auVar41._12_4_ = fVar1;
            auVar31 = vfmadd231ps_fma(auVar90,auVar41,(undefined1  [16])bupper1.lower.field_0);
            auVar42._0_4_ = fVar72 * blower0.upper.field_0._0_4_;
            auVar42._4_4_ = fVar72 * blower0.upper.field_0._4_4_;
            auVar42._8_4_ = fVar72 * blower0.upper.field_0._8_4_;
            auVar42._12_4_ = fVar72 * blower0.upper.field_0._12_4_;
            auVar44 = vfmadd231ps_fma(auVar42,auVar41,(undefined1  [16])bupper1.upper.field_0);
          }
          else {
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      (&blower1,&local_200,(long)(iVar23 + 1));
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      (&bupper0,&local_200,(long)((int)local_1d8 + -1));
            auVar31 = vmaxss_avx(ZEXT416((uint)fVar72),ZEXT816(0) << 0x40);
            fVar73 = auVar31._0_4_;
            fVar72 = 1.0 - fVar73;
            auVar47._0_4_ = fVar73 * blower1.lower.field_0.m128[0];
            auVar47._4_4_ = fVar73 * blower1.lower.field_0.m128[1];
            auVar47._8_4_ = fVar73 * blower1.lower.field_0.m128[2];
            auVar47._12_4_ = fVar73 * blower1.lower.field_0.m128[3];
            auVar48._4_4_ = fVar72;
            auVar48._0_4_ = fVar72;
            auVar48._8_4_ = fVar72;
            auVar48._12_4_ = fVar72;
            auVar32 = vfmadd231ps_fma(auVar47,auVar48,(undefined1  [16])blower0.lower.field_0);
            auVar34._0_4_ = fVar73 * blower1.upper.field_0.m128[0];
            auVar34._4_4_ = fVar73 * blower1.upper.field_0.m128[1];
            auVar34._8_4_ = fVar73 * blower1.upper.field_0.m128[2];
            auVar34._12_4_ = fVar73 * blower1.upper.field_0.m128[3];
            auVar35 = vfmadd231ps_fma(auVar34,auVar48,(undefined1  [16])blower0.upper.field_0);
            auVar31 = vmaxss_avx(ZEXT416((uint)(fVar86 - fVar74)),ZEXT816(0) << 0x40);
            fVar74 = auVar31._0_4_;
            fVar72 = 1.0 - fVar74;
            auVar36._0_4_ = fVar74 * bupper0.lower.field_0.m128[0];
            auVar36._4_4_ = fVar74 * bupper0.lower.field_0.m128[1];
            auVar36._8_4_ = fVar74 * bupper0.lower.field_0.m128[2];
            auVar36._12_4_ = fVar74 * bupper0.lower.field_0.m128[3];
            auVar30._4_4_ = fVar72;
            auVar30._0_4_ = fVar72;
            auVar30._8_4_ = fVar72;
            auVar30._12_4_ = fVar72;
            auVar31 = vfmadd231ps_fma(auVar36,auVar30,(undefined1  [16])bupper1.lower.field_0);
            auVar89._0_4_ = fVar74 * bupper0.upper.field_0.m128[0];
            auVar89._4_4_ = fVar74 * bupper0.upper.field_0.m128[1];
            auVar89._8_4_ = fVar74 * bupper0.upper.field_0.m128[2];
            auVar89._12_4_ = fVar74 * bupper0.upper.field_0.m128[3];
            auVar44 = vfmadd231ps_fma(auVar89,auVar30,(undefined1  [16])bupper1.upper.field_0);
            local_1d8 = local_198 - local_178;
            if (local_1b8 < 0) {
              local_1b8 = -1;
            }
            itime = (size_t)local_1b8;
            while( true ) {
              auVar49 = ZEXT816(0) << 0x40;
              itime = itime + 1;
              if ((long)iVar15 <= (long)itime) break;
              fVar74 = ((float)(int)itime / fVar1 - local_178) / local_1d8;
              fVar72 = 1.0 - fVar74;
              auVar38._0_4_ = auVar31._0_4_ * fVar74;
              fVar97 = auVar31._4_4_;
              auVar38._4_4_ = fVar97 * fVar74;
              fVar98 = auVar31._8_4_;
              auVar38._8_4_ = fVar98 * fVar74;
              fVar99 = auVar31._12_4_;
              auVar38._12_4_ = fVar99 * fVar74;
              auVar37._4_4_ = fVar72;
              auVar37._0_4_ = fVar72;
              auVar37._8_4_ = fVar72;
              auVar37._12_4_ = fVar72;
              auVar49 = vfmadd231ps_fma(auVar38,auVar37,auVar32);
              local_198 = auVar49._0_4_;
              uStack_194 = auVar49._4_4_;
              uStack_190 = auVar49._8_8_;
              auVar33._0_4_ = auVar44._0_4_ * fVar74;
              fVar72 = auVar44._4_4_;
              auVar33._4_4_ = fVar72 * fVar74;
              fVar86 = auVar44._8_4_;
              auVar33._8_4_ = fVar86 * fVar74;
              fVar73 = auVar44._12_4_;
              auVar33._12_4_ = fVar73 * fVar74;
              auVar49 = vfmadd231ps_fma(auVar33,auVar35,auVar37);
              local_1b8 = auVar49._0_4_;
              uStack_1b4 = auVar49._4_4_;
              uStack_1b0 = auVar49._8_8_;
              linearBounds::anon_class_16_2_07cfa4d6::operator()(&bi,&local_200,itime);
              local_298 = auVar35._0_4_;
              fStack_294 = auVar35._4_4_;
              fStack_290 = auVar35._8_4_;
              fStack_28c = auVar35._12_4_;
              local_288 = auVar32._0_4_;
              fStack_284 = auVar32._4_4_;
              fStack_280 = auVar32._8_4_;
              fStack_27c = auVar32._12_4_;
              auVar29._4_4_ = uStack_194;
              auVar29._0_4_ = local_198;
              auVar29._8_8_ = uStack_190;
              auVar49 = vsubps_avx((undefined1  [16])bi.lower.field_0,auVar29);
              auVar45._4_4_ = uStack_1b4;
              auVar45._0_4_ = local_1b8;
              auVar45._8_8_ = uStack_1b0;
              auVar32 = vsubps_avx((undefined1  [16])bi.upper.field_0,auVar45);
              auVar35 = vminps_avx(auVar49,ZEXT816(0) << 0x40);
              auVar49 = vmaxps_avx(auVar32,ZEXT816(0) << 0x40);
              auVar32._0_4_ = local_288 + auVar35._0_4_;
              auVar32._4_4_ = fStack_284 + auVar35._4_4_;
              auVar32._8_4_ = fStack_280 + auVar35._8_4_;
              auVar32._12_4_ = fStack_27c + auVar35._12_4_;
              auVar31._0_4_ = auVar31._0_4_ + auVar35._0_4_;
              auVar31._4_4_ = fVar97 + auVar35._4_4_;
              auVar31._8_4_ = fVar98 + auVar35._8_4_;
              auVar31._12_4_ = fVar99 + auVar35._12_4_;
              auVar35._0_4_ = local_298 + auVar49._0_4_;
              auVar35._4_4_ = fStack_294 + auVar49._4_4_;
              auVar35._8_4_ = fStack_290 + auVar49._8_4_;
              auVar35._12_4_ = fStack_28c + auVar49._12_4_;
              auVar44._0_4_ = auVar44._0_4_ + auVar49._0_4_;
              auVar44._4_4_ = fVar72 + auVar49._4_4_;
              auVar44._8_4_ = fVar86 + auVar49._8_4_;
              auVar44._12_4_ = fVar73 + auVar49._12_4_;
            }
          }
          auVar95 = ZEXT1664(auVar49);
          uVar13 = vcmpps_avx512vl(auVar32,auVar35,2);
          auVar91 = ZEXT1664(auVar28);
          auVar93 = ZEXT1664(auVar75);
          auVar49 = vbroadcastss_avx512vl(ZEXT416(0xddccb9a2));
          auVar104 = ZEXT1664(auVar49);
          auVar49 = vbroadcastss_avx512vl(ZEXT416(0x5dccb9a2));
          auVar105 = ZEXT1664(auVar49);
          if (((~(ushort)uVar13 & 7) == 0) &&
             (uVar13 = vcmpps_avx512vl(auVar31,auVar44,2), (~(ushort)uVar13 & 7) == 0)) {
            auVar31 = vminps_avx(auVar32,auVar31);
            aVar11 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                     vinsertps_avx(auVar31,ZEXT416(geomID),0x30);
            auVar31 = vmaxps_avx(auVar35,auVar44);
            aVar12 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                     vinsertps_avx(auVar31,ZEXT416((uint)uVar27),0x30);
            auVar88._0_4_ = aVar11.x + aVar12.x;
            auVar88._4_4_ = aVar11.y + aVar12.y;
            auVar88._8_4_ = aVar11.z + aVar12.z;
            auVar88._12_4_ = aVar11.field_3.w + aVar12.field_3.w;
            local_258 = vminps_avx(local_258,(undefined1  [16])aVar11);
            local_248 = vmaxps_avx(local_248,(undefined1  [16])aVar12);
            auVar28 = vminps_avx(auVar28,auVar88);
            auVar91 = ZEXT1664(auVar28);
            auVar28 = vmaxps_avx(auVar75,auVar88);
            auVar93 = ZEXT1664(auVar28);
            local_260 = local_260 + 1;
            prims[local_268].lower.field_0.field_1 = aVar11;
            prims[local_268].upper.field_0.field_1 = aVar12;
            local_268 = local_268 + 1;
          }
          goto LAB_01c33eb3;
        }
        lVar8 = *(long *)((long)pBVar4 + lVar25 + -0x10);
        lVar9 = *(long *)((long)&(pBVar4->super_RawBufferView).ptr_ofs + lVar25);
        auVar31 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar21);
        auVar32 = auVar104._0_16_;
        uVar13 = vcmpps_avx512vl(auVar31,auVar32,6);
        auVar35 = auVar105._0_16_;
        uVar14 = vcmpps_avx512vl(auVar31,auVar35,1);
        if ((byte)((byte)uVar13 & (byte)uVar14) == 0xf) {
          auVar44 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar22);
          uVar13 = vcmpps_avx512vl(auVar44,auVar32,6);
          uVar14 = vcmpps_avx512vl(auVar44,auVar35,1);
          if ((byte)((byte)uVar13 & (byte)uVar14) == 0xf) {
            lVar8 = *(long *)((long)pBVar6 + lVar25 + -0x10);
            lVar9 = *(long *)((long)&(pBVar6->super_RawBufferView).ptr_ofs + lVar25);
            auVar48 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar21);
            uVar13 = vcmpps_avx512vl(auVar48,auVar32,6);
            uVar14 = vcmpps_avx512vl(auVar48,auVar35,1);
            if ((byte)((byte)uVar13 & (byte)uVar14) == 0xf) {
              auVar30 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar22);
              uVar13 = vcmpps_avx512vl(auVar30,auVar32,6);
              uVar14 = vcmpps_avx512vl(auVar30,auVar35,1);
              if ((byte)((byte)uVar13 & (byte)uVar14) == 0xf) {
                lVar8 = *(long *)((long)pBVar5 + lVar25 + -0x10);
                lVar9 = *(long *)((long)&(pBVar5->super_RawBufferView).ptr_ofs + lVar25);
                auVar89 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar21);
                uVar13 = vcmpps_avx512vl(auVar89,auVar32,6);
                uVar14 = vcmpps_avx512vl(auVar89,auVar35,1);
                if ((~((ushort)uVar13 & (ushort)uVar14) & 7) == 0) {
                  auVar47 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar22);
                  uVar13 = vcmpps_avx512vl(auVar47,auVar32,6);
                  uVar14 = vcmpps_avx512vl(auVar47,auVar35,1);
                  if ((~((ushort)uVar13 & (ushort)uVar14) & 7) == 0) {
                    lVar8 = *(long *)((long)pBVar7 + lVar25 + -0x10);
                    lVar9 = *(long *)((long)&(pBVar7->super_RawBufferView).ptr_ofs + lVar25);
                    auVar34 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar21);
                    uVar13 = vcmpps_avx512vl(auVar34,auVar32,6);
                    uVar14 = vcmpps_avx512vl(auVar34,auVar35,1);
                    if ((~((ushort)uVar13 & (ushort)uVar14) & 7) == 0) {
                      auVar36 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar22);
                      uVar13 = vcmpps_avx512vl(auVar36,auVar32,6);
                      uVar14 = vcmpps_avx512vl(auVar36,auVar35,1);
                      if ((~((ushort)uVar13 & (ushort)uVar14) & 7) == 0) goto code_r0x01c3359a;
                    }
                  }
                }
              }
            }
          }
        }
        goto LAB_01c33e90;
      }
      goto LAB_01c33eb3;
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = local_258._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             lower.field_0 + 8) = local_258._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = local_248._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             upper.field_0 + 8) = local_248._8_8_;
    *(undefined1 (*) [16])
     (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
     field_0.m128 = auVar28;
    *(undefined1 (*) [16])
     (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
     field_0.m128 = auVar75;
    __return_storage_ptr__->end = local_260;
  }
  return __return_storage_ptr__;
code_r0x01c3359a:
  auVar32 = vshufps_avx(auVar31,auVar31,0xff);
  auVar45 = vinsertps_avx512f(auVar31,ZEXT416((uint)(auVar32._0_4_ * fVar72)),0x30);
  auVar31 = vshufps_avx(auVar48,auVar48,0xff);
  auVar31 = vinsertps_avx512f(auVar48,ZEXT416((uint)(auVar31._0_4_ * fVar72)),0x30);
  auVar82._8_4_ = 0xbeaaaaab;
  auVar82._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar82._12_4_ = 0xbeaaaaab;
  auVar29 = vfnmadd213ps_avx512vl(auVar31,auVar82,auVar45);
  auVar31 = vshufps_avx(auVar30,auVar30,0xff);
  auVar32 = vinsertps_avx512f(auVar30,ZEXT416((uint)(auVar31._0_4_ * fVar72)),0x30);
  auVar31 = vshufps_avx(auVar44,auVar44,0xff);
  auVar44 = vinsertps_avx512f(auVar44,ZEXT416((uint)(auVar31._0_4_ * fVar72)),0x30);
  auVar30 = vfmadd213ps_avx512vl(auVar32,auVar82,auVar44);
  auVar90 = ZEXT816(0) << 0x40;
  auVar31 = vmulps_avx512vl(auVar44,auVar90);
  auVar31 = vfmadd231ps_avx512vl(auVar31,auVar30,auVar90);
  auVar32 = vfmadd213ps_avx512vl(ZEXT816(0),auVar29,auVar31);
  auVar33 = vaddps_avx512vl(auVar45,auVar32);
  auVar32 = vshufps_avx(auVar33,auVar33,0xff);
  auVar48 = vfnmadd213ps_fma(auVar34,auVar82,auVar89);
  auVar34 = vfmadd213ps_avx512vl(auVar36,auVar82,auVar47);
  auVar35 = vmulps_avx512vl(auVar47,auVar90);
  auVar36 = vfmadd231ps_avx512vl(auVar35,auVar34,auVar90);
  auVar35 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar48,auVar36);
  auVar76._0_4_ = auVar89._0_4_ + auVar35._0_4_;
  auVar76._4_4_ = auVar89._4_4_ + auVar35._4_4_;
  auVar76._8_4_ = auVar89._8_4_ + auVar35._8_4_;
  auVar76._12_4_ = auVar89._12_4_ + auVar35._12_4_;
  auVar92._8_4_ = 0x40400000;
  auVar92._0_8_ = 0x4040000040400000;
  auVar92._12_4_ = 0x40400000;
  auVar31 = vfmadd231ps_avx512vl(auVar31,auVar29,auVar92);
  auVar37 = vfnmadd231ps_avx512vl(auVar31,auVar45,auVar92);
  auVar38 = vshufps_avx512vl(auVar37,auVar37,0xc9);
  auVar31 = vshufps_avx(auVar76,auVar76,0xc9);
  auVar83._0_4_ = auVar37._0_4_ * auVar31._0_4_;
  auVar83._4_4_ = auVar37._4_4_ * auVar31._4_4_;
  auVar83._8_4_ = auVar37._8_4_ * auVar31._8_4_;
  auVar83._12_4_ = auVar37._12_4_ * auVar31._12_4_;
  auVar31 = vfmsub231ps_avx512vl(auVar83,auVar38,auVar76);
  auVar35 = vshufps_avx(auVar31,auVar31,0xc9);
  auVar31 = vdpps_avx(auVar35,auVar35,0x7f);
  auVar58._16_16_ = auVar39;
  auVar58._0_16_ = auVar90;
  auVar53._4_28_ = auVar58._4_28_;
  auVar53._0_4_ = auVar31._0_4_;
  auVar39 = vrsqrt14ss_avx512f(auVar90,auVar53._0_16_);
  auVar40 = vmulss_avx512f(auVar39,ZEXT416(0x3fc00000));
  auVar41 = vmulss_avx512f(auVar31,ZEXT416(0x3f000000));
  auVar41 = vmulss_avx512f(auVar41,auVar39);
  auVar39 = vmulss_avx512f(auVar41,ZEXT416((uint)(auVar39._0_4_ * auVar39._0_4_)));
  auVar39 = vsubss_avx512f(auVar40,auVar39);
  auVar40 = vbroadcastss_avx512vl(auVar39);
  auVar39 = vmulps_avx512vl(auVar40,auVar35);
  auVar41 = vmulps_avx512vl(auVar32,auVar39);
  auVar42 = vaddps_avx512vl(auVar33,auVar41);
  auVar36 = vfmadd231ps_avx512vl(auVar36,auVar48,auVar92);
  auVar36 = vfnmadd231ps_avx512vl(auVar36,auVar89,auVar92);
  auVar43 = vshufps_avx512vl(auVar36,auVar36,0xc9);
  auVar43 = vmulps_avx512vl(auVar37,auVar43);
  auVar36 = vfmsub231ps_avx512vl(auVar43,auVar38,auVar36);
  auVar57._8_4_ = 2;
  auVar57._0_8_ = 0x200000002;
  auVar57._12_4_ = 2;
  auVar57._16_4_ = 2;
  auVar57._20_4_ = 2;
  auVar57._24_4_ = 2;
  auVar57._28_4_ = 2;
  auVar50 = vpermps_avx512vl(auVar57,ZEXT1632(auVar42));
  auVar38 = vshufps_avx512vl(auVar37,auVar37,0xff);
  auVar38 = vmulps_avx512vl(auVar38,auVar39);
  auVar39 = vrcp14ss_avx512f(auVar90,auVar53._0_16_);
  auVar43 = vbroadcastss_avx512vl(auVar31);
  auVar31 = vfnmadd213ss_avx512f(auVar31,auVar39,SUB6416(ZEXT464(0x40000000),0));
  auVar39 = vmulss_avx512f(auVar39,auVar31);
  fVar74 = auVar39._0_4_;
  auVar39 = vshufps_avx512vl(auVar36,auVar36,0xc9);
  auVar31 = vmulps_avx512vl(auVar43,auVar39);
  auVar39 = vdpps_avx(auVar35,auVar39,0x7f);
  fVar86 = auVar39._0_4_;
  auVar77._0_4_ = fVar86 * auVar35._0_4_;
  auVar77._4_4_ = fVar86 * auVar35._4_4_;
  auVar77._8_4_ = fVar86 * auVar35._8_4_;
  auVar77._12_4_ = fVar86 * auVar35._12_4_;
  auVar39 = vsubps_avx512vl(auVar31,auVar77);
  auVar78._0_4_ = fVar74 * auVar39._0_4_;
  auVar78._4_4_ = fVar74 * auVar39._4_4_;
  auVar78._8_4_ = fVar74 * auVar39._8_4_;
  auVar78._12_4_ = fVar74 * auVar39._12_4_;
  auVar39 = vmulps_avx512vl(auVar40,auVar78);
  auVar79._0_4_ = auVar32._0_4_ * auVar39._0_4_;
  auVar79._4_4_ = auVar32._4_4_ * auVar39._4_4_;
  auVar79._8_4_ = auVar32._8_4_ * auVar39._8_4_;
  auVar79._12_4_ = auVar32._12_4_ * auVar39._12_4_;
  auVar36 = vaddps_avx512vl(auVar38,auVar79);
  auVar80._0_4_ = auVar37._0_4_ + auVar36._0_4_;
  auVar80._4_4_ = auVar37._4_4_ + auVar36._4_4_;
  auVar80._8_4_ = auVar37._8_4_ + auVar36._8_4_;
  auVar80._12_4_ = auVar37._12_4_ + auVar36._12_4_;
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar39 = vmulps_avx512vl(auVar80,auVar40);
  auVar43 = vaddps_avx512vl(auVar42,auVar39);
  auVar51 = vpermps_avx512vl(auVar57,ZEXT1632(auVar43));
  auVar55._16_16_ = auVar51._16_16_;
  auVar39 = vxorps_avx512vl(auVar38,auVar38);
  auVar35 = vfmadd213ps_avx512vl(auVar39,auVar30,auVar44);
  auVar39 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar34,auVar47);
  auVar39 = vfmadd231ps_fma(auVar39,auVar48,auVar90);
  auVar31 = vfmadd231ps_fma(auVar39,auVar89,auVar90);
  auVar39 = vmulps_avx512vl(auVar44,auVar92);
  auVar39 = vfnmadd231ps_avx512vl(auVar39,auVar92,auVar30);
  auVar39 = vfmadd231ps_avx512vl(auVar39,auVar90,auVar29);
  auVar44 = vfnmadd231ps_avx512vl(auVar39,auVar90,auVar45);
  auVar30 = vshufps_avx512vl(auVar44,auVar44,0xc9);
  auVar39 = vshufps_avx(auVar31,auVar31,0xc9);
  auVar39 = vmulps_avx512vl(auVar44,auVar39);
  auVar39 = vfmsub231ps_fma(auVar39,auVar30,auVar31);
  auVar32 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar39 = vdpps_avx(auVar32,auVar32,0x7f);
  auVar31 = vfmadd231ps_avx512vl(auVar35,auVar29,auVar90);
  auVar45 = vfmadd231ps_avx512vl(auVar31,auVar45,auVar90);
  fVar74 = auVar39._0_4_;
  auVar55._0_16_ = auVar90;
  auVar54._4_28_ = auVar55._4_28_;
  auVar54._0_4_ = fVar74;
  auVar31 = vrsqrt14ss_avx512f(auVar90,auVar54._0_16_);
  auVar35 = vmulss_avx512f(auVar39,ZEXT416(0x3f000000));
  auVar35 = vmulss_avx512f(auVar35,auVar31);
  auVar29 = vmulss_avx512f(auVar31,auVar31);
  auVar35 = vmulss_avx512f(auVar35,auVar29);
  auVar29 = vshufps_avx512vl(auVar45,auVar45,0xff);
  auVar31 = vmulss_avx512f(auVar31,ZEXT416(0x3fc00000));
  auVar31 = vsubss_avx512f(auVar31,auVar35);
  auVar38 = vbroadcastss_avx512vl(auVar31);
  auVar46 = vmulps_avx512vl(auVar32,auVar38);
  auVar101._0_4_ = auVar47._0_4_ * 3.0;
  auVar101._4_4_ = auVar47._4_4_ * 3.0;
  auVar101._8_4_ = auVar47._8_4_ * 3.0;
  auVar101._12_4_ = auVar47._12_4_ * 3.0;
  auVar31 = vfnmadd231ps_avx512vl(auVar101,auVar92,auVar34);
  auVar47 = vmulps_avx512vl(auVar29,auVar46);
  auVar31 = vfmadd231ps_fma(auVar31,auVar90,auVar48);
  auVar48 = vaddps_avx512vl(auVar45,auVar47);
  auVar35 = vfnmadd231ps_fma(auVar31,auVar90,auVar89);
  auVar31 = vshufps_avx(auVar35,auVar35,0xc9);
  auVar31 = vmulps_avx512vl(auVar44,auVar31);
  auVar31 = vfmsub231ps_fma(auVar31,auVar30,auVar35);
  auVar35 = vshufps_avx512vl(auVar44,auVar44,0xff);
  auVar31 = vshufps_avx(auVar31,auVar31,0xc9);
  auVar102._0_4_ = fVar74 * auVar31._0_4_;
  auVar102._4_4_ = fVar74 * auVar31._4_4_;
  auVar102._8_4_ = fVar74 * auVar31._8_4_;
  auVar102._12_4_ = fVar74 * auVar31._12_4_;
  auVar31 = vdpps_avx(auVar32,auVar31,0x7f);
  auVar35 = vmulps_avx512vl(auVar35,auVar46);
  fVar74 = auVar31._0_4_;
  auVar84._0_4_ = fVar74 * auVar32._0_4_;
  auVar84._4_4_ = fVar74 * auVar32._4_4_;
  auVar84._8_4_ = fVar74 * auVar32._8_4_;
  auVar84._12_4_ = fVar74 * auVar32._12_4_;
  auVar31 = vsubps_avx(auVar102,auVar84);
  auVar32 = vrcp14ss_avx512f(auVar90,auVar54._0_16_);
  auVar39 = vfnmadd213ss_fma(auVar39,auVar32,SUB6416(ZEXT464(0x40000000),0));
  fVar74 = auVar32._0_4_ * auVar39._0_4_;
  auVar81._0_4_ = auVar31._0_4_ * fVar74;
  auVar81._4_4_ = auVar31._4_4_ * fVar74;
  auVar81._8_4_ = auVar31._8_4_ * fVar74;
  auVar81._12_4_ = auVar31._12_4_ * fVar74;
  auVar39 = vmulps_avx512vl(auVar38,auVar81);
  auVar39 = vmulps_avx512vl(auVar29,auVar39);
  auVar35 = vaddps_avx512vl(auVar35,auVar39);
  auVar39 = vaddps_avx512vl(auVar44,auVar35);
  auVar39 = vmulps_avx512vl(auVar39,auVar40);
  auVar39 = vsubps_avx(auVar48,auVar39);
  auVar56 = vpermps_avx2(auVar57,ZEXT1632(auVar39));
  auVar58 = vpermps_avx2(auVar57,ZEXT1632(auVar48));
  auVar69._8_8_ = bezier_basis0._3952_8_;
  auVar69._0_8_ = bezier_basis0._3944_8_;
  auVar69._16_8_ = bezier_basis0._3960_8_;
  auVar69._24_8_ = bezier_basis0._3968_8_;
  auVar52 = vmulps_avx512vl(auVar58,auVar69);
  auVar16._8_8_ = bezier_basis0._2796_8_;
  auVar16._0_8_ = bezier_basis0._2788_8_;
  auVar16._16_8_ = bezier_basis0._2804_8_;
  auVar16._24_8_ = bezier_basis0._2812_8_;
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar16,auVar56);
  auVar70._8_8_ = bezier_basis0._1640_8_;
  auVar70._0_8_ = bezier_basis0._1632_8_;
  auVar70._16_8_ = bezier_basis0._1648_8_;
  auVar70._24_8_ = bezier_basis0._1656_8_;
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar70,auVar51);
  auVar71._8_8_ = bezier_basis0._484_8_;
  auVar71._0_8_ = bezier_basis0._476_8_;
  auVar71._16_8_ = bezier_basis0._492_8_;
  auVar71._24_8_ = bezier_basis0._500_8_;
  auVar53 = vfmadd231ps_avx512vl(auVar52,auVar71,auVar50);
  auVar54 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  auVar55 = vmaxps_avx512vl(auVar54,auVar53);
  auVar18._8_8_ = bezier_basis0._8576_8_;
  auVar18._0_8_ = bezier_basis0._8568_8_;
  auVar18._16_8_ = bezier_basis0._8584_8_;
  auVar18._24_8_ = bezier_basis0._8592_8_;
  fVar74 = (float)bezier_basis0._8568_8_;
  fVar86 = SUB84(bezier_basis0._8568_8_,4);
  auVar52._4_4_ = fVar86 * auVar58._4_4_;
  auVar52._0_4_ = fVar74 * auVar58._0_4_;
  fVar73 = (float)bezier_basis0._8576_8_;
  auVar52._8_4_ = fVar73 * auVar58._8_4_;
  fVar97 = SUB84(bezier_basis0._8576_8_,4);
  auVar52._12_4_ = fVar97 * auVar58._12_4_;
  fVar98 = (float)bezier_basis0._8584_8_;
  auVar52._16_4_ = fVar98 * auVar58._16_4_;
  fVar99 = SUB84(bezier_basis0._8584_8_,4);
  auVar52._20_4_ = fVar99 * auVar58._20_4_;
  fVar100 = (float)bezier_basis0._8592_8_;
  auVar52._24_4_ = fVar100 * auVar58._24_4_;
  auVar52._28_4_ = auVar58._28_4_;
  auVar19._8_8_ = bezier_basis0._7420_8_;
  auVar19._0_8_ = bezier_basis0._7412_8_;
  auVar19._16_8_ = bezier_basis0._7428_8_;
  auVar19._24_8_ = bezier_basis0._7436_8_;
  auVar31 = vfmadd231ps_fma(auVar52,auVar19,auVar56);
  auVar20._8_8_ = bezier_basis0._6264_8_;
  auVar20._0_8_ = bezier_basis0._6256_8_;
  auVar20._16_8_ = bezier_basis0._6272_8_;
  auVar20._24_8_ = bezier_basis0._6280_8_;
  auVar56 = vfmadd231ps_avx512vl(ZEXT1632(auVar31),auVar20,auVar51);
  auVar17._8_8_ = bezier_basis0._5108_8_;
  auVar17._0_8_ = bezier_basis0._5100_8_;
  auVar17._16_8_ = bezier_basis0._5116_8_;
  auVar17._24_8_ = bezier_basis0._5124_8_;
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar17,auVar50);
  auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3d638e39));
  auVar58 = vmulps_avx512vl(auVar56,auVar57);
  auVar56 = vblendps_avx(auVar58,ZEXT432(0) << 0x40,1);
  auVar50 = vsubps_avx512vl(auVar53,auVar56);
  auVar56 = vblendps_avx(auVar58,ZEXT432(0) << 0x40,0x80);
  auVar51 = vaddps_avx512vl(auVar53,auVar56);
  auVar56 = vmaxps_avx(auVar50,auVar51);
  auVar58 = vmaxps_avx(auVar55,auVar56);
  auVar55 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar56 = vpermps_avx512vl(auVar55,ZEXT1632(auVar42));
  auVar52 = vpermps_avx512vl(auVar55,ZEXT1632(auVar43));
  auVar59 = vpermps_avx512vl(auVar55,ZEXT1632(auVar39));
  auVar60 = vpermps_avx512vl(auVar55,ZEXT1632(auVar48));
  auVar61 = vmulps_avx512vl(auVar60,auVar69);
  auVar61 = vfmadd231ps_avx512vl(auVar61,auVar16,auVar59);
  auVar61 = vfmadd231ps_avx512vl(auVar61,auVar70,auVar52);
  auVar61 = vfmadd231ps_avx512vl(auVar61,auVar71,auVar56);
  auVar60 = vmulps_avx512vl(auVar60,auVar18);
  auVar59 = vfmadd231ps_avx512vl(auVar60,auVar19,auVar59);
  auVar60 = vmaxps_avx512vl(auVar54,auVar61);
  auVar52 = vfmadd231ps_avx512vl(auVar59,auVar20,auVar52);
  auVar56 = vfmadd231ps_avx512vl(auVar52,auVar17,auVar56);
  auVar52 = vmulps_avx512vl(auVar56,auVar57);
  auVar56 = vblendps_avx(auVar52,ZEXT832(0) << 0x20,1);
  auVar59 = vsubps_avx512vl(auVar61,auVar56);
  auVar56 = vblendps_avx(auVar52,ZEXT832(0) << 0x20,0x80);
  auVar62 = vaddps_avx512vl(auVar61,auVar56);
  auVar56 = vmaxps_avx512vl(auVar59,auVar62);
  auVar60 = vmaxps_avx512vl(auVar60,auVar56);
  auVar52 = vbroadcastss_avx512vl(auVar42);
  auVar63 = vbroadcastss_avx512vl(auVar43);
  auVar65._0_4_ = auVar39._0_4_;
  auVar65._4_4_ = auVar65._0_4_;
  auVar65._8_4_ = auVar65._0_4_;
  auVar65._12_4_ = auVar65._0_4_;
  auVar65._16_4_ = auVar65._0_4_;
  auVar65._20_4_ = auVar65._0_4_;
  auVar65._24_4_ = auVar65._0_4_;
  auVar65._28_4_ = auVar65._0_4_;
  auVar67._0_4_ = auVar48._0_4_;
  auVar67._4_4_ = auVar67._0_4_;
  auVar67._8_4_ = auVar67._0_4_;
  auVar67._12_4_ = auVar67._0_4_;
  auVar67._16_4_ = auVar67._0_4_;
  auVar67._20_4_ = auVar67._0_4_;
  auVar67._24_4_ = auVar67._0_4_;
  auVar67._28_4_ = auVar67._0_4_;
  auVar56 = vmulps_avx512vl(auVar67,auVar69);
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar16,auVar65);
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar70,auVar63);
  auVar64 = vfmadd231ps_avx512vl(auVar56,auVar71,auVar52);
  auVar56._4_4_ = auVar67._0_4_ * fVar86;
  auVar56._0_4_ = auVar67._0_4_ * fVar74;
  auVar56._8_4_ = auVar67._0_4_ * fVar73;
  auVar56._12_4_ = auVar67._0_4_ * fVar97;
  auVar56._16_4_ = auVar67._0_4_ * fVar98;
  auVar56._20_4_ = auVar67._0_4_ * fVar99;
  auVar56._24_4_ = auVar67._0_4_ * fVar100;
  auVar56._28_4_ = auVar67._0_4_;
  auVar39 = vfmadd231ps_fma(auVar56,auVar19,auVar65);
  auVar65 = vmaxps_avx512vl(auVar54,auVar64);
  auVar56 = vfmadd231ps_avx512vl(ZEXT1632(auVar39),auVar20,auVar63);
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar17,auVar52);
  auVar52 = vmulps_avx512vl(auVar56,auVar57);
  auVar56 = vblendps_avx(auVar52,ZEXT832(0) << 0x20,1);
  auVar63 = vsubps_avx512vl(auVar64,auVar56);
  auVar56 = vblendps_avx(auVar52,ZEXT832(0) << 0x20,0x80);
  auVar66 = vaddps_avx512vl(auVar64,auVar56);
  auVar56 = vmaxps_avx512vl(auVar63,auVar66);
  auVar52 = vmaxps_avx(auVar65,auVar56);
  auVar56 = vminps_avx(auVar50,auVar51);
  auVar65 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
  auVar50 = vminps_avx512vl(auVar65,auVar53);
  auVar53 = vminps_avx512vl(auVar50,auVar56);
  auVar56 = vminps_avx512vl(auVar65,auVar61);
  auVar50 = vminps_avx512vl(auVar59,auVar62);
  auVar59 = vminps_avx512vl(auVar56,auVar50);
  auVar56 = vminps_avx512vl(auVar65,auVar64);
  auVar50 = vminps_avx512vl(auVar63,auVar66);
  auVar61 = vminps_avx512vl(auVar56,auVar50);
  auVar32 = vsubps_avx(auVar33,auVar41);
  uVar103 = auVar32._0_4_;
  auVar66._4_4_ = uVar103;
  auVar66._0_4_ = uVar103;
  auVar66._8_4_ = uVar103;
  auVar66._12_4_ = uVar103;
  auVar66._16_4_ = uVar103;
  auVar66._20_4_ = uVar103;
  auVar66._24_4_ = uVar103;
  auVar66._28_4_ = uVar103;
  auVar39 = vsubps_avx(auVar37,auVar36);
  auVar85._0_4_ = auVar39._0_4_ * 0.33333334;
  auVar85._4_4_ = auVar39._4_4_ * 0.33333334;
  auVar85._8_4_ = auVar39._8_4_ * 0.33333334;
  auVar85._12_4_ = auVar39._12_4_ * 0.33333334;
  auVar48 = vaddps_avx512vl(auVar32,auVar85);
  auVar56 = vbroadcastss_avx512vl(auVar48);
  auVar30 = vsubps_avx512vl(auVar45,auVar47);
  auVar39 = vsubps_avx512vl(auVar44,auVar35);
  auVar87._0_4_ = auVar39._0_4_ * 0.33333334;
  auVar87._4_4_ = auVar39._4_4_ * 0.33333334;
  auVar87._8_4_ = auVar39._8_4_ * 0.33333334;
  auVar87._12_4_ = auVar39._12_4_ * 0.33333334;
  auVar35 = vsubps_avx512vl(auVar30,auVar87);
  auVar51 = vbroadcastss_avx512vl(auVar35);
  auVar62 = vbroadcastss_avx512vl(auVar30);
  auVar63._0_4_ = auVar62._0_4_ * local_1d8;
  auVar63._4_4_ = auVar62._4_4_ * fStack_1d4;
  auVar63._8_4_ = auVar62._8_4_ * (float)bezier_basis0._3952_8_;
  auVar63._12_4_ = auVar62._12_4_ * SUB84(bezier_basis0._3952_8_,4);
  auVar63._16_4_ = auVar62._16_4_ * (float)bezier_basis0._3960_8_;
  auVar63._20_4_ = auVar62._20_4_ * SUB84(bezier_basis0._3960_8_,4);
  auVar63._24_4_ = auVar62._24_4_ * (float)bezier_basis0._3968_8_;
  auVar63._28_4_ = 0;
  auVar39 = vfmadd231ps_fma(auVar63,auVar16,auVar51);
  auVar39 = vfmadd231ps_fma(ZEXT1632(auVar39),auVar70,auVar56);
  auVar63 = vfmadd231ps_avx512vl(ZEXT1632(auVar39),auVar71,auVar66);
  auVar64 = vmaxps_avx512vl(auVar54,auVar63);
  auVar50._4_4_ = fVar86 * auVar62._4_4_;
  auVar50._0_4_ = fVar74 * auVar62._0_4_;
  auVar50._8_4_ = fVar73 * auVar62._8_4_;
  auVar50._12_4_ = fVar97 * auVar62._12_4_;
  auVar50._16_4_ = fVar98 * auVar62._16_4_;
  auVar50._20_4_ = fVar99 * auVar62._20_4_;
  auVar50._24_4_ = fVar100 * auVar62._24_4_;
  auVar50._28_4_ = auVar62._28_4_;
  auVar39 = vfmadd231ps_fma(auVar50,auVar19,auVar51);
  auVar56 = vfmadd231ps_avx512vl(ZEXT1632(auVar39),auVar20,auVar56);
  auVar39 = vfmadd231ps_fma(auVar56,auVar17,auVar66);
  auVar50 = vmulps_avx512vl(ZEXT1632(auVar39),auVar57);
  auVar96 = ZEXT832(0) << 0x20;
  auVar56 = vblendps_avx(auVar50,auVar96,1);
  auVar62 = vsubps_avx512vl(auVar63,auVar56);
  auVar56 = vblendps_avx(auVar50,auVar96,0x80);
  auVar66 = vaddps_avx512vl(auVar63,auVar56);
  auVar56 = vmaxps_avx512vl(auVar62,auVar66);
  auVar56 = vmaxps_avx(auVar64,auVar56);
  auVar50 = vshufps_avx(auVar56,auVar56,0xb1);
  auVar56 = vmaxps_avx(auVar56,auVar50);
  auVar50 = vshufpd_avx(auVar56,auVar56,5);
  auVar56 = vmaxps_avx(auVar56,auVar50);
  auVar39 = vmaxps_avx(auVar56._0_16_,auVar56._16_16_);
  auVar56 = vpermps_avx512vl(auVar55,ZEXT1632(auVar32));
  auVar50 = vpermps_avx512vl(auVar55,ZEXT1632(auVar48));
  auVar64 = vpermps_avx512vl(auVar55,ZEXT1632(auVar35));
  auVar55 = vpermps_avx512vl(auVar55,ZEXT1632(auVar30));
  auVar51 = vmulps_avx512vl(auVar55,auVar69);
  auVar51 = vfmadd231ps_avx512vl(auVar51,auVar16,auVar64);
  auVar51 = vfmadd231ps_avx512vl(auVar51,auVar70,auVar50);
  auVar67 = vfmadd231ps_avx512vl(auVar51,auVar71,auVar56);
  auVar51._4_4_ = fVar86 * auVar55._4_4_;
  auVar51._0_4_ = fVar74 * auVar55._0_4_;
  auVar51._8_4_ = fVar73 * auVar55._8_4_;
  auVar51._12_4_ = fVar97 * auVar55._12_4_;
  auVar51._16_4_ = fVar98 * auVar55._16_4_;
  auVar51._20_4_ = fVar99 * auVar55._20_4_;
  auVar51._24_4_ = fVar100 * auVar55._24_4_;
  auVar51._28_4_ = auVar55._28_4_;
  auVar31 = vfmadd231ps_fma(auVar51,auVar19,auVar64);
  auVar51 = vmaxps_avx512vl(auVar54,auVar67);
  auVar50 = vfmadd231ps_avx512vl(ZEXT1632(auVar31),auVar20,auVar50);
  auVar31 = vfmadd231ps_fma(auVar50,auVar17,auVar56);
  auVar50 = vmulps_avx512vl(ZEXT1632(auVar31),auVar57);
  auVar56 = vblendps_avx(auVar50,ZEXT832(0) << 0x20,1);
  auVar55 = vsubps_avx512vl(auVar67,auVar56);
  auVar56 = vblendps_avx(auVar50,ZEXT832(0) << 0x20,0x80);
  auVar64 = vaddps_avx512vl(auVar67,auVar56);
  auVar56 = vmaxps_avx(auVar55,auVar64);
  auVar56 = vmaxps_avx(auVar51,auVar56);
  auVar50 = vshufps_avx(auVar56,auVar56,0xb1);
  auVar56 = vmaxps_avx(auVar56,auVar50);
  auVar50 = vshufpd_avx(auVar56,auVar56,5);
  auVar56 = vmaxps_avx(auVar56,auVar50);
  auVar31 = vmaxps_avx(auVar56._0_16_,auVar56._16_16_);
  auVar39 = vunpcklps_avx(auVar39,auVar31);
  auVar56 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar50 = vpermps_avx512vl(auVar56,ZEXT1632(auVar32));
  auVar51 = vpermps_avx512vl(auVar56,ZEXT1632(auVar48));
  auVar68 = vpermps_avx512vl(auVar56,ZEXT1632(auVar35));
  auVar56 = vpermps_avx512vl(auVar56,ZEXT1632(auVar30));
  auVar69 = vmulps_avx512vl(auVar56,auVar69);
  auVar69 = vfmadd231ps_avx512vl(auVar69,auVar16,auVar68);
  auVar69 = vfmadd231ps_avx512vl(auVar69,auVar70,auVar51);
  auVar69 = vfmadd231ps_avx512vl(auVar69,auVar71,auVar50);
  auVar56 = vmulps_avx512vl(auVar56,auVar18);
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar19,auVar68);
  auVar70 = vmaxps_avx512vl(auVar54,auVar69);
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar20,auVar51);
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar17,auVar50);
  auVar50 = vmulps_avx512vl(auVar56,auVar57);
  auVar56 = vblendps_avx(auVar50,auVar96,1);
  auVar51 = vsubps_avx512vl(auVar69,auVar56);
  auVar56 = vblendps_avx(auVar50,auVar96,0x80);
  auVar71 = vaddps_avx512vl(auVar69,auVar56);
  auVar56 = vmaxps_avx512vl(auVar51,auVar71);
  auVar56 = vmaxps_avx512vl(auVar70,auVar56);
  auVar50 = vshufps_avx512vl(auVar56,auVar56,0xb1);
  auVar56 = vmaxps_avx512vl(auVar56,auVar50);
  auVar50 = vshufpd_avx512vl(auVar56,auVar56,5);
  auVar56 = vmaxps_avx512vl(auVar56,auVar50);
  auVar31 = vextractf32x4_avx512vl(auVar56,1);
  auVar31 = vmaxps_avx512vl(auVar56._0_16_,auVar31);
  auVar31 = vinsertps_avx(auVar39,auVar31,0x28);
  auVar56 = vminps_avx512vl(auVar62,auVar66);
  auVar50 = vminps_avx512vl(auVar65,auVar63);
  auVar56 = vminps_avx(auVar50,auVar56);
  auVar50 = vshufps_avx(auVar56,auVar56,0xb1);
  auVar56 = vminps_avx(auVar56,auVar50);
  auVar50 = vshufpd_avx(auVar56,auVar56,5);
  auVar56 = vminps_avx(auVar56,auVar50);
  auVar39 = vminps_avx(auVar56._0_16_,auVar56._16_16_);
  auVar56 = vminps_avx(auVar55,auVar64);
  auVar50 = vminps_avx512vl(auVar65,auVar67);
  auVar48 = vbroadcastss_avx512vl(ZEXT416(0xddccb9a2));
  auVar104 = ZEXT1664(auVar48);
  auVar56 = vminps_avx(auVar50,auVar56);
  auVar50 = vshufps_avx(auVar56,auVar56,0xb1);
  auVar56 = vminps_avx(auVar56,auVar50);
  auVar50 = vshufpd_avx(auVar56,auVar56,5);
  auVar56 = vminps_avx(auVar56,auVar50);
  auVar32 = vminps_avx(auVar56._0_16_,auVar56._16_16_);
  auVar32 = vunpcklps_avx(auVar39,auVar32);
  auVar56 = vminps_avx(auVar51,auVar71);
  auVar50 = vminps_avx512vl(auVar65,auVar69);
  auVar56 = vminps_avx(auVar50,auVar56);
  auVar50 = vshufps_avx(auVar56,auVar56,0xb1);
  auVar56 = vminps_avx(auVar56,auVar50);
  auVar50 = vshufpd_avx(auVar56,auVar56,5);
  auVar56 = vminps_avx(auVar56,auVar50);
  auVar39 = vminps_avx(auVar56._0_16_,auVar56._16_16_);
  auVar32 = vinsertps_avx(auVar32,auVar39,0x28);
  auVar56 = vshufps_avx512vl(auVar61,auVar61,0xb1);
  auVar50 = vminps_avx512vl(auVar61,auVar56);
  auVar56 = vshufpd_avx(auVar50,auVar50,5);
  auVar56 = vminps_avx(auVar50,auVar56);
  auVar39 = vminps_avx(auVar56._0_16_,auVar56._16_16_);
  auVar56 = vshufps_avx512vl(auVar59,auVar59,0xb1);
  auVar50 = vminps_avx512vl(auVar59,auVar56);
  auVar56 = vshufpd_avx(auVar50,auVar50,5);
  auVar56 = vminps_avx(auVar50,auVar56);
  auVar35 = vminps_avx(auVar56._0_16_,auVar56._16_16_);
  auVar44 = vunpcklps_avx(auVar39,auVar35);
  auVar56 = vshufps_avx512vl(auVar53,auVar53,0xb1);
  auVar50 = vminps_avx512vl(auVar53,auVar56);
  auVar39 = auVar50._16_16_;
  auVar30 = vbroadcastss_avx512vl(ZEXT416(0x5dccb9a2));
  auVar105 = ZEXT1664(auVar30);
  auVar56 = vshufpd_avx(auVar50,auVar50,5);
  auVar56 = vminps_avx(auVar50,auVar56);
  auVar35 = vminps_avx(auVar56._0_16_,auVar56._16_16_);
  auVar35 = vinsertps_avx(auVar44,auVar35,0x28);
  auVar44 = vminps_avx(auVar32,auVar35);
  auVar56 = vshufps_avx(auVar52,auVar52,0xb1);
  auVar56 = vmaxps_avx(auVar52,auVar56);
  auVar52 = vshufpd_avx(auVar56,auVar56,5);
  auVar56 = vmaxps_avx(auVar56,auVar52);
  auVar32 = vmaxps_avx(auVar56._0_16_,auVar56._16_16_);
  auVar56 = vshufps_avx(auVar60,auVar60,0xb1);
  auVar56 = vmaxps_avx(auVar60,auVar56);
  auVar52 = vshufpd_avx(auVar56,auVar56,5);
  auVar56 = vmaxps_avx(auVar56,auVar52);
  auVar35 = vmaxps_avx(auVar56._0_16_,auVar56._16_16_);
  auVar35 = vunpcklps_avx(auVar32,auVar35);
  auVar56 = vshufps_avx(auVar58,auVar58,0xb1);
  auVar56 = vmaxps_avx(auVar58,auVar56);
  auVar58 = vshufpd_avx(auVar56,auVar56,5);
  auVar56 = vmaxps_avx(auVar56,auVar58);
  auVar32 = vmaxps_avx(auVar56._0_16_,auVar56._16_16_);
  auVar32 = vinsertps_avx(auVar35,auVar32,0x28);
  auVar31 = vmaxps_avx(auVar31,auVar32);
  uVar13 = vcmpps_avx512vl(auVar31,auVar30,1);
  uVar14 = vcmpps_avx512vl(auVar44,auVar48,6);
  lVar25 = lVar25 + 0x38;
  if ((~((ushort)uVar13 & (ushort)uVar14) & 7) != 0) goto LAB_01c33e90;
  goto LAB_01c33421;
LAB_01c33e90:
  auVar91 = ZEXT1664(auVar28);
  auVar93 = ZEXT1664(auVar75);
  auVar95 = ZEXT1664(ZEXT816(0) << 0x40);
LAB_01c33eb3:
  uVar27 = uVar27 + 1;
  goto LAB_01c332b0;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(this->time_range, time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbounds = linearBounds(j,t0t1);
          if (lbounds.bounds0.empty() || lbounds.bounds1.empty()) continue; // checks oriented curves with invalid normals which cause NaNs here
          const PrimRef prim(lbounds.bounds(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }